

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

void __thiscall
QFileSystemModelPrivate::removeVisibleFile
          (QFileSystemModelPrivate *this,QFileSystemNode *parentNode,int vLocation)

{
  QModelIndex *pQVar1;
  bool bVar2;
  int iVar3;
  QFileSystemNode *pQVar4;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (vLocation != -1) {
    pQVar1 = *(QModelIndex **)&this->field_0x8;
    local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    index((QFileSystemModelPrivate *)local_48,(char *)this,(int)parentNode);
    bVar2 = isHiddenByFilter(this,parentNode,(QModelIndex *)local_48);
    if (bVar2) {
      pQVar4 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                         (&parentNode->children,(parentNode->visibleChildren).d.ptr + vLocation);
      pQVar4->isVisible = false;
      QList<QString>::removeAt(&parentNode->visibleChildren,(long)vLocation);
    }
    else {
      iVar3 = translateVisibleLocation(this,parentNode,vLocation);
      translateVisibleLocation(this,parentNode,vLocation);
      QAbstractItemModel::beginRemoveRows(pQVar1,(int)local_48,iVar3);
      pQVar4 = QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                         (&parentNode->children,(parentNode->visibleChildren).d.ptr + vLocation);
      pQVar4->isVisible = false;
      QList<QString>::removeAt(&parentNode->visibleChildren,(long)vLocation);
      QAbstractItemModel::endRemoveRows();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModelPrivate::removeVisibleFile(QFileSystemNode *parentNode, int vLocation)
{
    Q_Q(QFileSystemModel);
    if (vLocation == -1)
        return;
    QModelIndex parent = index(parentNode);
    bool indexHidden = isHiddenByFilter(parentNode, parent);
    if (!indexHidden)
        q->beginRemoveRows(parent, translateVisibleLocation(parentNode, vLocation),
                                       translateVisibleLocation(parentNode, vLocation));
    parentNode->children.value(parentNode->visibleChildren.at(vLocation))->isVisible = false;
    parentNode->visibleChildren.removeAt(vLocation);
    if (!indexHidden)
        q->endRemoveRows();
}